

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::compile_abi_cxx11_(string *__return_storage_ptr__,CompilerGLSL *this)

{
  bool bVar1;
  ExecutionModel model;
  uint32_t id;
  SPIRFunction *func;
  SPIREntryPoint *pSVar2;
  bool local_94;
  bool local_93;
  byte local_92;
  byte local_91;
  Bitset local_68;
  uint32_t local_1c;
  CompilerGLSL *pCStack_18;
  uint32_t pass_count;
  CompilerGLSL *this_local;
  
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  ParsedIR::fixup_reserved_names(&(this->super_Compiler).ir);
  if (((this->options).vulkan_semantics & 1U) == 0) {
    (this->backend).nonuniform_qualifier = "";
    (this->backend).needs_row_major_load_workaround =
         (bool)((this->options).enable_row_major_load_workaround & 1);
  }
  local_91 = 1;
  if (((this->options).vulkan_semantics & 1U) == 0) {
    local_91 = (this->options).es;
  }
  (this->backend).allow_precision_qualifiers = (bool)(local_91 & 1);
  (this->backend).force_gl_in_out_block = true;
  (this->backend).supports_extensions = true;
  (this->backend).use_array_constructor = true;
  (this->backend).workgroup_size_is_hidden = true;
  local_92 = 1;
  if (((this->options).es & 1U) == 0) {
    local_92 = (this->options).vulkan_semantics;
  }
  (this->backend).requires_relaxed_precision_analysis = (bool)(local_92 & 1);
  if ((((this->options).es & 1U) != 0) || (local_93 = true, (this->options).version < 400)) {
    local_94 = false;
    if (((this->options).es & 1U) != 0) {
      local_94 = 0x13f < (this->options).version;
    }
    local_93 = local_94;
  }
  (this->backend).support_precise_qualifier = local_93;
  ::std::__cxx11::string::operator=((string *)&(this->backend).constant_null_initializer,"{ }");
  (this->backend).requires_matching_array_initializer = true;
  bVar1 = is_legacy_es(this);
  if (bVar1) {
    (this->backend).support_case_fallthrough = false;
  }
  fixup_anonymous_struct_names(this);
  fixup_type_alias(this);
  reorder_type_alias(this);
  Compiler::build_function_control_flow_graphs_and_analyze(&this->super_Compiler);
  find_static_extensions(this);
  fixup_image_load_store_access(this);
  Compiler::update_active_builtins(&this->super_Compiler);
  Compiler::analyze_image_and_sampler_usage(&this->super_Compiler);
  Compiler::analyze_interlocked_resource_usage(&this->super_Compiler);
  bVar1 = ::std::
          vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>::
          empty(&this->inout_color_attachments);
  if (!bVar1) {
    emit_inout_fragment_outputs_copy_to_subpass_inputs(this);
  }
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    Compiler::analyze_non_block_pointer_types(&this->super_Compiler);
  }
  local_1c = 0;
  do {
    reset(this,local_1c);
    StringStream<4096UL,_4096UL>::reset(&this->buffer);
    (*(this->super_Compiler)._vptr_Compiler[0xe])();
    emit_resources(this);
    model = Compiler::get_execution_model(&this->super_Compiler);
    emit_extension_workarounds(this,model);
    if (this->required_polyfills != 0) {
      emit_polyfills(this,this->required_polyfills,false);
    }
    if (((((this->options).es & 1U) != 0) || (((this->options).vulkan_semantics & 1U) != 0)) &&
       (this->required_polyfills_relaxed != 0)) {
      emit_polyfills(this,this->required_polyfills_relaxed,true);
    }
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&(this->super_Compiler).ir.default_entry_point);
    func = Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,id);
    local_68.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_68.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_68.higher._M_h._M_element_count = 0;
    local_68.higher._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_68.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_68.higher._M_h._M_bucket_count = 0;
    local_68.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68.lower = 0;
    local_68.higher._M_h._M_buckets = (__buckets_ptr)0x0;
    Bitset::Bitset(&local_68);
    emit_function(this,func,&local_68);
    Bitset::~Bitset(&local_68);
    local_1c = local_1c + 1;
    bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  } while (bVar1);
  if (((this->super_Compiler).interlocked_is_complex & 1U) != 0) {
    statement<char_const(&)[12]>(this,(char (*) [12])"void main()");
    begin_scope(this);
    statement<char_const(&)[78]>
              (this,(char (*) [78])
                    "// Interlocks were used in a way not compatible with GLSL, this is very slow.")
    ;
    statement<char_const(&)[40]>(this,(char (*) [40])"SPIRV_Cross_beginInvocationInterlock();");
    statement<char_const(&)[26]>(this,(char (*) [26])"spvMainInterlockedBody();");
    statement<char_const(&)[38]>(this,(char (*) [38])"SPIRV_Cross_endInvocationInterlock();");
    end_scope(this);
  }
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  ::std::__cxx11::string::operator=((string *)&pSVar2->name,"main");
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&this->buffer);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::compile()
{
	ir.fixup_reserved_names();

	if (!options.vulkan_semantics)
	{
		// only NV_gpu_shader5 supports divergent indexing on OpenGL, and it does so without extra qualifiers
		backend.nonuniform_qualifier = "";
		backend.needs_row_major_load_workaround = options.enable_row_major_load_workaround;
	}
	backend.allow_precision_qualifiers = options.vulkan_semantics || options.es;
	backend.force_gl_in_out_block = true;
	backend.supports_extensions = true;
	backend.use_array_constructor = true;
	backend.workgroup_size_is_hidden = true;
	backend.requires_relaxed_precision_analysis = options.es || options.vulkan_semantics;
	backend.support_precise_qualifier =
			(!options.es && options.version >= 400) || (options.es && options.version >= 320);
	backend.constant_null_initializer = "{ }";
	backend.requires_matching_array_initializer = true;

	if (is_legacy_es())
		backend.support_case_fallthrough = false;

	// Scan the SPIR-V to find trivial uses of extensions.
	fixup_anonymous_struct_names();
	fixup_type_alias();
	reorder_type_alias();
	build_function_control_flow_graphs_and_analyze();
	find_static_extensions();
	fixup_image_load_store_access();
	update_active_builtins();
	analyze_image_and_sampler_usage();
	analyze_interlocked_resource_usage();
	if (!inout_color_attachments.empty())
		emit_inout_fragment_outputs_copy_to_subpass_inputs();

	// Shaders might cast unrelated data to pointers of non-block types.
	// Find all such instances and make sure we can cast the pointers to a synthesized block type.
	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
		analyze_non_block_pointer_types();

	uint32_t pass_count = 0;
	do
	{
		reset(pass_count);

		buffer.reset();

		emit_header();
		emit_resources();
		emit_extension_workarounds(get_execution_model());

		if (required_polyfills != 0)
			emit_polyfills(required_polyfills, false);
		if ((options.es || options.vulkan_semantics) && required_polyfills_relaxed != 0)
			emit_polyfills(required_polyfills_relaxed, true);

		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	// Implement the interlocked wrapper function at the end.
	// The body was implemented in lieu of main().
	if (interlocked_is_complex)
	{
		statement("void main()");
		begin_scope();
		statement("// Interlocks were used in a way not compatible with GLSL, this is very slow.");
		statement("SPIRV_Cross_beginInvocationInterlock();");
		statement("spvMainInterlockedBody();");
		statement("SPIRV_Cross_endInvocationInterlock();");
		end_scope();
	}

	// Entry point in GLSL is always main().
	get_entry_point().name = "main";

	return buffer.str();
}